

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

POMCPPrior * __thiscall despot::BaseTag::CreatePOMCPPrior(BaseTag *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  string *name_local;
  BaseTag *this_local;
  
  bVar1 = std::operator==(name,"UNIFORM");
  if (bVar1) {
    this_local = (BaseTag *)operator_new(0x78);
    despot::UniformPOMCPPrior::UniformPOMCPPrior
              ((UniformPOMCPPrior *)this_local,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"SHR");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported POMCP prior: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
    }
    this_local = (BaseTag *)operator_new(0x80);
    TagPOMCPPrior::TagPOMCPPrior((TagPOMCPPrior *)this_local,(DSPOMDP *)&this->super_BeliefMDP);
  }
  return (POMCPPrior *)this_local;
}

Assistant:

POMCPPrior* BaseTag::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM") {
		return new UniformPOMCPPrior(this);
	} else if (name == "DEFAULT" || name == "SHR") {
		return new TagPOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}